

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createNoResultOp
          (Builder *this,Op opCode,vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  bool bVar1;
  Instruction *this_00;
  size_type count;
  reference puVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  Id local_44;
  const_iterator cStack_40;
  uint id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Instruction *op;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Op opCode_local;
  Builder *this_local;
  
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,opCode);
  count = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(operands);
  spv::Instruction::reserveOperands(this_00,count);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(operands);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(operands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_44 = *puVar2;
    spv::Instruction::addIdOperand(this_00,local_44);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_50,this_00
            );
  addInstruction(this,&local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

void Builder::createNoResultOp(Op opCode, const std::vector<Id>& operands)
{
    Instruction* op = new Instruction(opCode);
    op->reserveOperands(operands.size());
    for (auto id : operands) {
        op->addIdOperand(id);
    }
    addInstruction(std::unique_ptr<Instruction>(op));
}